

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling::make_padding(Pooling *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  void *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  Option opt_b_3;
  int hpad_1;
  int wpad_1;
  Option opt_b_2;
  int hpad;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int htail;
  int wtail;
  int htailpad;
  int wtailpad;
  float pad_value;
  int h;
  int w;
  undefined4 local_1a4;
  undefined8 *in_stack_fffffffffffffe60;
  float v;
  undefined8 *puVar2;
  Mat *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe90;
  Option *in_stack_fffffffffffffe98;
  undefined1 local_140 [8];
  undefined8 local_138;
  int local_100;
  int local_fc;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  undefined4 local_64;
  int local_60;
  int local_5c;
  void *local_58;
  undefined8 *local_48;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_20;
  int local_18;
  undefined4 local_14;
  void *local_8;
  
  local_5c = *(int *)((long)in_RSI + 0x2c);
  local_60 = *(int *)(in_RSI + 6);
  local_58 = in_RCX;
  local_48 = in_RSI;
  local_20 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != 0) {
      piVar1 = (int *)in_RSI[1];
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar2 = in_RDX;
    local_30 = in_RSI;
    if (in_RDX[1] != 0) {
      piVar1 = (int *)in_RDX[1];
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (in_RDX[4] == 0) {
          local_8 = (void *)*in_RDX;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = 0;
    in_RDX[2] = 0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = 0;
    in_RDX[1] = 0;
    *puVar2 = *local_30;
    puVar2[1] = local_30[1];
    puVar2[2] = local_30[2];
    *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(local_30 + 3);
    puVar2[4] = local_30[4];
    *(undefined4 *)(puVar2 + 5) = *(undefined4 *)(local_30 + 5);
    *(undefined4 *)((long)puVar2 + 0x2c) = *(undefined4 *)((long)local_30 + 0x2c);
    *(undefined4 *)(puVar2 + 6) = *(undefined4 *)(local_30 + 6);
    *(undefined4 *)((long)puVar2 + 0x34) = *(undefined4 *)((long)local_30 + 0x34);
    *(undefined4 *)(puVar2 + 7) = *(undefined4 *)(local_30 + 7);
    puVar2[8] = local_30[8];
    in_stack_fffffffffffffe60 = in_RDX;
    local_20 = puVar2;
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_1a4 = 0xc3000000;
    if (local_48[2] != 1) {
      local_1a4 = 0xff7fffff;
    }
    local_64 = local_1a4;
  }
  else {
    local_64 = 0;
  }
  local_68 = 0;
  local_6c = 0;
  v = (float)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  if (*(int *)(in_RDI + 0xf8) == 0) {
    local_70 = ((local_5c + *(int *)(in_RDI + 0xe4) + *(int *)(in_RDI + 0xe8)) -
               *(int *)(in_RDI + 0xd4)) % *(int *)(in_RDI + 0xdc);
    local_74 = ((local_60 + *(int *)(in_RDI + 0xec) + *(int *)(in_RDI + 0xf0)) -
               *(int *)(in_RDI + 0xd8)) % *(int *)(in_RDI + 0xe0);
    if (local_70 != 0) {
      local_68 = *(int *)(in_RDI + 0xdc) - local_70;
    }
    if (local_74 != 0) {
      local_6c = *(int *)(in_RDI + 0xe0) - local_74;
    }
    memcpy(local_b8,local_58,0x40);
    local_b0 = *(undefined8 *)((long)local_58 + 0x10);
    copy_make_border(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                     (int)in_RDI,in_stack_fffffffffffffe90,v,in_stack_fffffffffffffe98);
  }
  else if (*(int *)(in_RDI + 0xf8) == 1) {
    memcpy(local_f8,local_58,0x40);
    local_f0 = *(undefined8 *)((long)local_58 + 0x10);
    copy_make_border(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                     (int)in_RDI,in_stack_fffffffffffffe90,v,in_stack_fffffffffffffe98);
  }
  else if (*(int *)(in_RDI + 0xf8) == 2) {
    local_fc = (*(int *)(in_RDI + 0xd4) +
               ((local_5c + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc)) - local_5c;
    local_100 = (*(int *)(in_RDI + 0xd8) +
                ((local_60 + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0)) - local_60;
    if ((0 < local_fc) || (0 < local_100)) {
      memcpy(local_140,local_58,0x40);
      local_138 = *(undefined8 *)((long)local_58 + 0x10);
      copy_make_border(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                       (int)in_RDI,in_stack_fffffffffffffe90,v,in_stack_fffffffffffffe98);
    }
  }
  else if ((*(int *)(in_RDI + 0xf8) == 3) &&
          ((0 < (*(int *)(in_RDI + 0xd4) +
                ((local_5c + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc)) - local_5c ||
           (0 < (*(int *)(in_RDI + 0xd8) +
                ((local_60 + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0)) - local_60)))
          ) {
    memcpy(&stack0xfffffffffffffe78,local_58,0x40);
    copy_make_border(*(Mat **)((long)local_58 + 0x10),in_stack_fffffffffffffe78,
                     (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                     (int)in_RDI,in_stack_fffffffffffffe90,v,in_stack_fffffffffffffe98);
  }
  return;
}

Assistant:

void Pooling::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}